

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

vector<float,_std::allocator<float>_> *
readFromSep<float>(vector<float,_std::allocator<float>_> *__return_storage_ptr__,char *cdata,
                  char sep)

{
  iterator __position;
  double dVar1;
  char *__nptr;
  ulong uVar2;
  float local_2c;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (*cdata != '\0') {
    uVar2 = 0;
    __nptr = cdata;
    do {
      dVar1 = atof(__nptr);
      local_2c = (float)dVar1;
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (__return_storage_ptr__,__position,&local_2c);
      }
      else {
        *__position._M_current = local_2c;
        (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      do {
        uVar2 = (ulong)((int)uVar2 + 1);
        if (cdata[uVar2] == '\0') break;
      } while (cdata[uVar2] != sep);
      __nptr = cdata + uVar2;
    } while (cdata[uVar2] != '\0');
  }
  return __return_storage_ptr__;
}

Assistant:

vector<T> readFromSep(const char * cdata, char sep=' ') {
    vector<T> arr;
    unsigned int begin = 0;
    while (cdata[begin] != '\0') {
        arr.push_back((float)atof(cdata + begin));
        ++begin;
        while (cdata[begin] != '\0' && cdata[begin] != sep) {
            ++begin;
        }
    }
    return arr;
}